

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::pop
          (iterator *this)

{
  bool bVar1;
  byte bVar2;
  stack_entry *psVar3;
  key_prefix_size prefix_len;
  iterator *this_local;
  
  bVar1 = empty(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                  ,0x17d,
                  "void unodb::db<unsigned long, std::span<const std::byte>>::iterator::pop() [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  psVar3 = top(this);
  bVar2 = detail::key_prefix_snapshot::length((key_prefix_snapshot *)&(psVar3->prefix).f);
  detail::key_buffer::pop(&this->keybuf_,(ulong)bVar2);
  std::
  stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
  ::pop(&this->stack_);
  return;
}

Assistant:

void pop() noexcept {
      UNODB_DETAIL_ASSERT(!empty());

      const auto prefix_len = top().prefix.length();
      keybuf_.pop(prefix_len);
      stack_.pop();
    }